

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory64Lowering.cpp
# Opt level: O0

void __thiscall
wasm::Memory64Lowering::wrapAddress64(Memory64Lowering *this,Expression **ptr,Name memoryName)

{
  Name name;
  bool bVar1;
  Module *this_00;
  Memory *this_01;
  Unary *pUVar2;
  Builder local_60;
  Builder builder;
  Memory *memory;
  Module *module;
  Expression **local_28;
  Expression **ptr_local;
  Memory64Lowering *this_local;
  Name memoryName_local;
  
  memoryName_local.super_IString.str._M_len = memoryName.super_IString.str._M_str;
  this_local = memoryName.super_IString.str._M_len;
  module._4_4_ = 1;
  local_28 = ptr;
  ptr_local = (Expression **)this;
  bVar1 = wasm::Type::operator==(&(*ptr)->type,(BasicType *)((long)&module + 4));
  if (!bVar1) {
    this_00 = Walker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>::
              getModule(&(this->
                         super_WalkerPass<wasm::PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>_>
                         ).
                         super_PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>
                         .
                         super_Walker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>
                       );
    name.super_IString.str._M_str = (char *)memoryName_local.super_IString.str._M_len;
    name.super_IString.str._M_len = (size_t)this_local;
    this_01 = Module::getMemory(this_00,name);
    bVar1 = Memory::is64(this_01);
    if (bVar1) {
      builder.wasm._4_4_ = 3;
      bVar1 = wasm::Type::operator==(&(*local_28)->type,(BasicType *)((long)&builder.wasm + 4));
      if (!bVar1) {
        __assert_fail("ptr->type == Type::i64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Memory64Lowering.cpp"
                      ,0x2b,"void wasm::Memory64Lowering::wrapAddress64(Expression *&, Name)");
      }
      Builder::Builder(&local_60,this_00);
      pUVar2 = Builder::makeUnary(&local_60,WrapInt64,*local_28);
      *local_28 = (Expression *)pUVar2;
    }
  }
  return;
}

Assistant:

void wrapAddress64(Expression*& ptr, Name memoryName) {
    if (ptr->type == Type::unreachable) {
      return;
    }
    auto& module = *getModule();
    auto memory = module.getMemory(memoryName);
    if (memory->is64()) {
      assert(ptr->type == Type::i64);
      Builder builder(module);
      ptr = builder.makeUnary(UnaryOp::WrapInt64, ptr);
    }
  }